

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdTree.c
# Opt level: O3

int Dsd_TreeGetAigCost_rec(Dsd_Node_t *pNode)

{
  Dsd_Type_t DVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  if (pNode == (Dsd_Node_t *)0x0) {
    __assert_fail("pNode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x103,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  if (((ulong)pNode & 1) == 0) {
    if (-1 < pNode->nVisits) {
      iVar2 = (int)pNode->nDecs;
      iVar3 = 0;
      if (1 < iVar2) {
        DVar1 = pNode->Type;
        if (DVar1 == DSD_NODE_PRIME) {
          iVar3 = (uint)(pNode->nDecs == 3) * 3;
        }
        else if (DVar1 == DSD_NODE_EXOR) {
          iVar3 = iVar2 * 3 + -3;
        }
        else {
          iVar3 = 0;
          if (DVar1 == DSD_NODE_OR) {
            iVar3 = iVar2 + -1;
          }
        }
        lVar4 = 0;
        do {
          iVar2 = Dsd_TreeGetAigCost_rec
                            ((Dsd_Node_t *)((ulong)pNode->pDecs[lVar4] & 0xfffffffffffffffe));
          iVar3 = iVar3 + iVar2;
          lVar4 = lVar4 + 1;
        } while (lVar4 < pNode->nDecs);
      }
      return iVar3;
    }
    __assert_fail("pNode->nVisits >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                  ,0x105,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
  }
  __assert_fail("!Dsd_IsComplement( pNode )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/dsd/dsdTree.c"
                ,0x104,"int Dsd_TreeGetAigCost_rec(Dsd_Node_t *)");
}

Assistant:

int Dsd_TreeGetAigCost_rec( Dsd_Node_t * pNode )
{
    int i, Counter = 0;

    assert( pNode );
    assert( !Dsd_IsComplement( pNode ) );
    assert( pNode->nVisits >= 0 );

    if ( pNode->nDecs < 2 )
        return 0;

    // we don't want the two-input gates to count for non-decomposable blocks
    if ( pNode->Type == DSD_NODE_OR )
        Counter += pNode->nDecs - 1;
    else if ( pNode->Type == DSD_NODE_EXOR )
        Counter += 3*(pNode->nDecs - 1);
    else if ( pNode->Type == DSD_NODE_PRIME && pNode->nDecs == 3 )
        Counter += 3;

    // call recursively
    for ( i = 0; i < pNode->nDecs; i++ )
        Counter += Dsd_TreeGetAigCost_rec( Dsd_Regular(pNode->pDecs[i]) );
    return Counter;
}